

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_parser.cpp
# Opt level: O0

Token * __thiscall clickhouse::TypeParser::NextToken(TypeParser *this)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  ulong *in_RSI;
  Token *in_RDI;
  char *st;
  
  do {
    if (in_RSI[1] <= *in_RSI) {
      in_RDI->type = EOS;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&in_RDI->value);
      return in_RDI;
    }
    switch(*(undefined1 *)*in_RSI) {
    case 0:
    case 9:
    case 10:
    case 0x20:
      *in_RSI = *in_RSI + 1;
      break;
    default:
      pcVar3 = (char *)*in_RSI;
      if (*(char *)*in_RSI == '\'') {
        pcVar3 = (char *)(*in_RSI + 1);
        *in_RSI = (ulong)pcVar3;
        while( true ) {
          if (in_RSI[1] <= *in_RSI) {
            in_RDI->type = Invalid;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&in_RDI->value)
            ;
            return in_RDI;
          }
          if (*(char *)*in_RSI == '\'') break;
          *in_RSI = *in_RSI + 1;
        }
        in_RDI->type = String;
        uVar1 = *in_RSI;
        *in_RSI = uVar1 + 1;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&in_RDI->value,pcVar3,uVar1 - (long)pcVar3);
        return in_RDI;
      }
      iVar2 = isalpha((int)*(char *)*in_RSI);
      if ((iVar2 == 0) && (*(char *)*in_RSI != '_')) {
        iVar2 = isdigit((int)*(char *)*in_RSI);
        if ((iVar2 == 0) && (*(char *)*in_RSI != '-')) {
          in_RDI->type = Invalid;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&in_RDI->value);
          return in_RDI;
        }
        *in_RSI = *in_RSI + 1;
        while ((*in_RSI < in_RSI[1] && (iVar2 = isdigit((int)*(char *)*in_RSI), iVar2 != 0))) {
          *in_RSI = *in_RSI + 1;
        }
        in_RDI->type = Number;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&in_RDI->value,pcVar3,*in_RSI - (long)pcVar3);
        return in_RDI;
      }
      while ((*in_RSI < in_RSI[1] &&
             (((iVar2 = isalpha((int)*(char *)*in_RSI), iVar2 != 0 ||
               (iVar2 = isdigit((int)*(char *)*in_RSI), iVar2 != 0)) || (*(char *)*in_RSI == '_'))))
            ) {
        *in_RSI = *in_RSI + 1;
      }
      in_RDI->type = Name;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&in_RDI->value,pcVar3,*in_RSI - (long)pcVar3);
      return in_RDI;
    case 0x28:
      in_RDI->type = LPar;
      pcVar3 = (char *)*in_RSI;
      *in_RSI = (ulong)(pcVar3 + 1);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&in_RDI->value,pcVar3,1);
      return in_RDI;
    case 0x29:
      in_RDI->type = RPar;
      pcVar3 = (char *)*in_RSI;
      *in_RSI = (ulong)(pcVar3 + 1);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&in_RDI->value,pcVar3,1);
      return in_RDI;
    case 0x2c:
      in_RDI->type = Comma;
      pcVar3 = (char *)*in_RSI;
      *in_RSI = (ulong)(pcVar3 + 1);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&in_RDI->value,pcVar3,1);
      return in_RDI;
    case 0x3d:
      in_RDI->type = Assign;
      pcVar3 = (char *)*in_RSI;
      *in_RSI = (ulong)(pcVar3 + 1);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&in_RDI->value,pcVar3,1);
      return in_RDI;
    }
  } while( true );
}

Assistant:

TypeParser::Token TypeParser::NextToken() {
    for (; cur_ < end_; ++cur_) {
        switch (*cur_) {
            case ' ':
            case '\n':
            case '\t':
            case '\0':
                continue;

            case '=':
                return Token{Token::Assign, std::string_view(cur_++, 1)};
            case '(':
                return Token{Token::LPar, std::string_view(cur_++, 1)};
            case ')':
                return Token{Token::RPar, std::string_view(cur_++, 1)};
            case ',':
                return Token{Token::Comma, std::string_view(cur_++, 1)};

            default: {
                const char* st = cur_;

                if (*cur_ == '\'') {
                    for (st = ++cur_; cur_ < end_; ++cur_) {
                        if (*cur_ == '\'') {
                            return Token{Token::String, std::string_view(st, cur_++ - st)};
                        }
                    }

                    return Token{Token::Invalid, std::string_view()};
                }

                if (isalpha(*cur_) || *cur_ == '_') {
                    for (; cur_ < end_; ++cur_) {
                        if (!isalpha(*cur_) && !isdigit(*cur_) && *cur_ != '_') {
                            break;
                        }
                    }

                    return Token{Token::Name, std::string_view(st, cur_ - st)};
                }

                if (isdigit(*cur_) || *cur_ == '-') {
                    for (++cur_; cur_ < end_; ++cur_) {
                        if (!isdigit(*cur_)) {
                            break;
                        }
                    }

                    return Token{Token::Number, std::string_view(st, cur_ - st)};
                }

                return Token{Token::Invalid, std::string_view()};
            }
        }
    }

    return Token{Token::EOS, std::string_view()};
}